

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitAtomicFence(BinaryInstWriter *this,AtomicFence *curr)

{
  BufferWithRandomAccess *pBVar1;
  AtomicFence *curr_local;
  BinaryInstWriter *this_local;
  
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,-2);
  pBVar1 = BufferWithRandomAccess::operator<<(pBVar1,'\x03');
  BufferWithRandomAccess::operator<<(pBVar1,curr->order);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicFence(AtomicFence* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix) << int8_t(BinaryConsts::AtomicFence)
    << int8_t(curr->order);
}